

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O3

void ipc_send_recv_helper_threadproc(void *arg)

{
  int iVar1;
  int iVar2;
  uv_loop_t *loop_00;
  undefined8 *extraout_RDX;
  uv_loop_t *unaff_RBX;
  int iVar3;
  uv_loop_t *puVar4;
  uv_loop_t loop;
  uv_buf_t uStack_400;
  undefined1 auStack_3f0 [144];
  code *pcStack_360;
  uv_loop_t uStack_358;
  
  iVar2 = (int)&uStack_358;
  pcStack_360 = (code *)0x15f5b9;
  iVar1 = uv_loop_init(&uStack_358);
  if (iVar1 == 0) {
    pcStack_360 = (code *)0x15f5cd;
    run_ipc_send_recv_helper(&uStack_358,1);
    pcStack_360 = (code *)0x15f5d5;
    iVar2 = (int)&uStack_358;
    iVar1 = uv_loop_close(&uStack_358);
    unaff_RBX = &uStack_358;
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    pcStack_360 = (code *)0x15f5e7;
    ipc_send_recv_helper_threadproc_cold_1();
  }
  pcStack_360 = run_test;
  ipc_send_recv_helper_threadproc_cold_2();
  loop_00 = (uv_loop_t *)auStack_3f0;
  puVar4 = (uv_loop_t *)auStack_3f0;
  pcStack_360 = (code *)unaff_RBX;
  if (iVar2 == 0) {
    uStack_400.len = 0x15f67c;
    spawn_helper(&ctx.channel,(uv_process_t *)(auStack_3f0 + 8),"ipc_send_recv_helper");
    uStack_400.len = 0x15f68a;
    connect_cb(&ctx.connect_req,0);
LAB_0015f68a:
    uStack_400.len = 0x15f68f;
    loop_00 = uv_default_loop();
    iVar3 = 0;
    uStack_400.len = 0x15f699;
    iVar1 = uv_run(loop_00,UV_RUN_DEFAULT);
    if (iVar1 != 0) {
      uStack_400.len = 0x15f6c4;
      run_test_cold_3();
LAB_0015f6c4:
      uStack_400.len = 0x15f6c9;
      run_test_cold_4();
LAB_0015f6c9:
      uStack_400.len = 0x15f6ce;
      run_test_cold_1();
      goto LAB_0015f6ce;
    }
    if (recv_cb_count != 2) goto LAB_0015f6c4;
    if (iVar2 == 0) {
      return;
    }
    uStack_400.len = 0x15f6b2;
    iVar2 = uv_thread_join((uv_thread_t *)auStack_3f0);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    iVar3 = 0x15f5a9;
    uStack_400.len = 0x15f60e;
    iVar1 = uv_thread_create((uv_thread_t *)auStack_3f0,ipc_send_recv_helper_threadproc,(void *)0x2a
                            );
    if (iVar1 != 0) goto LAB_0015f6c9;
    uStack_400.len = 0x15f620;
    uv_sleep(1000);
    uStack_400.len = 0x15f625;
    loop_00 = uv_default_loop();
    iVar3 = 0x2fef60;
    uStack_400.len = 0x15f639;
    iVar1 = uv_pipe_init(loop_00,&ctx.channel,1);
    if (iVar1 == 0) {
      uStack_400.len = 0x15f662;
      uv_pipe_connect(&ctx.connect_req,&ctx.channel,"/tmp/uv-test-sock3",connect_cb);
      goto LAB_0015f68a;
    }
LAB_0015f6ce:
    puVar4 = loop_00;
    uStack_400.len = 0x15f6d3;
    run_test_cold_2();
  }
  uStack_400.len = (size_t)connect_cb;
  run_test_cold_5();
  if (puVar4 == (uv_loop_t *)&ctx.connect_req) {
    if (iVar3 != 0) goto LAB_0015f7a8;
    uStack_400 = uv_buf_init(".",1);
    iVar2 = uv_write2(&ctx.write_req,(uv_stream_t *)&ctx,&uStack_400,1,&ctx.send.stream,
                      (uv_write_cb)0x0);
    if (iVar2 != 0) goto LAB_0015f7ad;
    uStack_400 = uv_buf_init(".",1);
    iVar2 = uv_write2(&ctx.write_req2,(uv_stream_t *)&ctx,&uStack_400,1,&ctx.send2.stream,
                      (uv_write_cb)0x0);
    if (iVar2 == 0) {
      iVar2 = uv_read_start((uv_stream_t *)&ctx,alloc_cb,recv_cb);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_0015f7b7;
    }
  }
  else {
    connect_cb_cold_1();
LAB_0015f7a8:
    connect_cb_cold_2();
LAB_0015f7ad:
    connect_cb_cold_3();
  }
  connect_cb_cold_4();
LAB_0015f7b7:
  connect_cb_cold_5();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 8;
  return;
}

Assistant:

void ipc_send_recv_helper_threadproc(void* arg) {
  int r;
  uv_loop_t loop;

  r = uv_loop_init(&loop);
  ASSERT(r == 0);

  r = run_ipc_send_recv_helper(&loop, 1);
  ASSERT(r == 0);

  r = uv_loop_close(&loop);
  ASSERT(r == 0);
}